

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::CreateASCompactedSizeQueryPool(DeviceContextVkImpl *this)

{
  RenderDeviceVkImpl *pRVar1;
  VkQueryPoolCreateInfo Info;
  QueryPoolWrapper local_50;
  VkQueryPoolCreateInfo local_38;
  
  pRVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  if ((pRVar1->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.RayTracing ==
      DEVICE_FEATURE_STATE_ENABLED) {
    local_38.pNext = (void *)0x0;
    local_38.flags = 0;
    local_38.pipelineStatistics = 0;
    local_38.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
    local_38._4_4_ = 0;
    local_38.queryType = VK_QUERY_TYPE_ACCELERATION_STRUCTURE_COMPACTED_SIZE_KHR;
    local_38.queryCount = 1;
    VulkanUtilities::VulkanLogicalDevice::CreateQueryPool
              (&local_50,
               (pRVar1->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_38,"AS Compacted Size Query");
    VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
    operator=(&this->m_ASQueryPool,&local_50);
    VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
    ~VulkanObjectWrapper(&local_50);
  }
  return;
}

Assistant:

T* operator->() const noexcept { return m_pObject; }